

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainClass *stm)

{
  CIdExp *pCVar1;
  CMainMethod *pCVar2;
  __shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  string *this_00;
  undefined1 local_58 [8];
  _Alloc_hider a_Stack_50 [6];
  
  this_00 = (string *)local_58;
  std::operator<<((ostream *)&std::cout,"typechecker: mainclass\n");
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 == (CIdExp *)0x0) {
    CError::CError((CError *)local_58,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_58);
  }
  else {
    p_Var3 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(this->table).
                              super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &pCVar1->name)->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,
               p_Var3);
    pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
    pCVar2 = (stm->mainMethod)._M_t.
             super___uniq_ptr_impl<CMainMethod,_std::default_delete<CMainMethod>_>._M_t.
             super__Tuple_impl<0UL,_CMainMethod_*,_std::default_delete<CMainMethod>_>.
             super__Head_base<0UL,_CMainMethod_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_58,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_58);
    this_00 = (string *)a_Stack_50;
  }
  std::__cxx11::string::~string(this_00);
  local_58 = (undefined1  [8])0x0;
  a_Stack_50[0]._M_p = (pointer)0x0;
  std::__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_50);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainClass &stm )
{
	std::cout << "typechecker: mainclass\n";
    if( stm.id ) {
        currentClass = table->classes[stm.id->name];
        stm.id->Accept( *this );
        stm.mainMethod->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}